

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SwapChainVkImpl::RecreateVulkanSwapchain
          (SwapChainVkImpl *this,DeviceContextVkImpl *pImmediateCtxVk)

{
  VkResult VVar1;
  RenderDeviceVkImpl *pRVar2;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  VkSurfaceCapabilitiesKHR local_44;
  
  ReleaseSwapChainResources(this,pImmediateCtxVk,false);
  pRVar2 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                     (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  VVar1 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                    (((pRVar2->m_PhysicalDevice)._M_t.
                      super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                      .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                     _M_head_impl)->m_VkDevice,this->m_VkSurface,&local_44);
  if (VVar1 == VK_ERROR_SURFACE_LOST_KHR) {
    if (this->m_VkSwapChain != (VkSwapchainKHR)0x0) {
      (*vkDestroySwapchainKHR)
                (((pRVar2->m_LogicalVkDevice).
                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->m_VkDevice,this->m_VkSwapChain,(VkAllocationCallbacks *)0x0);
      this->m_VkSwapChain = (VkSwapchainKHR)0x0;
    }
    CreateSurface(this);
  }
  CreateVulkanSwapChain(this);
  InitBuffersAndViews(this);
  return;
}

Assistant:

void SwapChainVkImpl::RecreateVulkanSwapchain(DeviceContextVkImpl* pImmediateCtxVk)
{
    // Do not destroy Vulkan swap chain as we will use it as oldSwapchain parameter.
    ReleaseSwapChainResources(pImmediateCtxVk, /*DestroyVkSwapChain*/ false);

    // Check if the surface is lost
    {
        RenderDeviceVkImpl*    pDeviceVk      = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
        const VkPhysicalDevice vkDeviceHandle = pDeviceVk->GetPhysicalDevice().GetVkDeviceHandle();

        VkSurfaceCapabilitiesKHR surfCapabilities;
        // Call vkGetPhysicalDeviceSurfaceCapabilitiesKHR only to check the return code
        VkResult err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
        if (err == VK_ERROR_SURFACE_LOST_KHR)
        {
            // Destroy the swap chain associated with the surface
            if (m_VkSwapChain != VK_NULL_HANDLE)
            {
                vkDestroySwapchainKHR(pDeviceVk->GetVkDevice(), m_VkSwapChain, NULL);
                m_VkSwapChain = VK_NULL_HANDLE;
            }

            // Recreate the surface
            CreateSurface();
        }
    }

    CreateVulkanSwapChain();
    InitBuffersAndViews();
}